

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O2

ExternalSigner * wallet::ExternalSignerScriptPubKeyMan::GetExternalSigner(void)

{
  long lVar1;
  string chain;
  bool bVar2;
  CChainParams *this;
  runtime_error *prVar3;
  ExternalSigner *in_RDI;
  long in_FS_OFFSET;
  vector<ExternalSigner,_std::allocator<ExternalSigner>_> signers;
  undefined8 uStack_b0;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string command;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"-signer",(allocator<char> *)&signers);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_a1);
  ArgsManager::GetArg(&command,&gArgs,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  bVar2 = std::operator==(&command,"");
  if (bVar2) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"GetExternalSigner",(allocator<char> *)&signers);
    std::operator+(&local_60,&local_80,": restart bitcoind with -signer=<cmd>");
    std::runtime_error::runtime_error(prVar3,(string *)&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    signers.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    signers.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    signers.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = Params();
    CChainParams::GetChainTypeString_abi_cxx11_(&local_a0,this);
    chain._M_string_length =
         (size_type)
         signers.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
         super__Vector_impl_data._M_finish;
    chain._M_dataplus._M_p =
         (pointer)signers.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    chain.field_2._M_allocated_capacity =
         (size_type)
         signers.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    chain.field_2._8_8_ = uStack_b0;
    ExternalSigner::Enumerate(&command,&signers,chain);
    std::__cxx11::string::~string((string *)&local_a0);
    if (signers.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
        super__Vector_impl_data._M_start ==
        signers.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"GetExternalSigner",&local_a1);
      std::operator+(&local_60,&local_80,": No external signers found");
      std::runtime_error::runtime_error(prVar3,(string *)&local_60);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if ((ulong)((long)signers.
                           super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)signers.
                          super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>.
                          _M_impl.super__Vector_impl_data._M_start) < 0x81) {
      ExternalSigner::ExternalSigner
                (in_RDI,signers.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::~vector(&signers);
      std::__cxx11::string::~string((string *)&command);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return in_RDI;
      }
    }
    else {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"GetExternalSigner",&local_a1);
      std::operator+(&local_60,&local_80,
                     ": More than one external signer found. Please connect only one at a time.");
      std::runtime_error::runtime_error(prVar3,(string *)&local_60);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

ExternalSigner ExternalSignerScriptPubKeyMan::GetExternalSigner() {
    const std::string command = gArgs.GetArg("-signer", "");
    if (command == "") throw std::runtime_error(std::string(__func__) + ": restart bitcoind with -signer=<cmd>");
    std::vector<ExternalSigner> signers;
    ExternalSigner::Enumerate(command, signers, Params().GetChainTypeString());
    if (signers.empty()) throw std::runtime_error(std::string(__func__) + ": No external signers found");
    // TODO: add fingerprint argument instead of failing in case of multiple signers.
    if (signers.size() > 1) throw std::runtime_error(std::string(__func__) + ": More than one external signer found. Please connect only one at a time.");
    return signers[0];
}